

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

void __thiscall
deqp::sl::ShaderParser::ShaderParser
          (ShaderParser *this,TestContext *testCtx,RenderContext *renderCtx)

{
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  ShaderParser *this_local;
  
  this->m_testCtx = testCtx;
  this->m_renderCtx = renderCtx;
  std::__cxx11::string::string((string *)&this->m_input);
  this->m_curPtr = (char *)0x0;
  this->m_curToken = TOKEN_LAST;
  std::__cxx11::string::string((string *)&this->m_curTokenStr);
  return;
}

Assistant:

ShaderParser::ShaderParser(tcu::TestContext& testCtx, RenderContext& renderCtx)
	: m_testCtx(testCtx), m_renderCtx(renderCtx), m_curPtr(DE_NULL), m_curToken(TOKEN_LAST)
{
}